

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtCollisionShape * __thiscall
cbtCollisionWorldImporter::convertCollisionShape
          (cbtCollisionWorldImporter *this,cbtCollisionShapeData *shapeData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  uint uVar4;
  cbtOptimizedBvh **ppcVar5;
  char *pcVar6;
  float fVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined8 uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  cbtConvexHullShape *pcVar20;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar21;
  cbtOptimizedBvh *pcVar22;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  cbtCollisionShape *pcVar23;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  cbtCollisionShape **__s;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  cbtVector3 *pcVar24;
  undefined4 extraout_var_18;
  _func_int **pp_Var25;
  undefined4 extraout_var_19;
  char *pcVar26;
  cbtStaticPlaneShapeData *planeData;
  long lVar27;
  undefined1 *puVar28;
  cbtAlignedObjectArray<cbtCollisionShape_*> *pcVar29;
  long lVar30;
  int i;
  long lVar31;
  cbtVector3 *pcVar32;
  long lVar33;
  int i_1;
  long lVar34;
  cbtCapsuleShape *cap;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  cbtAlignedObjectArray<cbtVector3> tmpPos;
  cbtAlignedObjectArray<float> radii;
  undefined1 local_98 [16];
  cbtVector3 *local_88;
  bool local_80;
  undefined4 auStack_68 [4];
  cbtAlignedObjectArray<cbtCollisionShape_*> local_58;
  undefined4 uVar10;
  undefined3 uVar12;
  undefined2 uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  pcVar29 = (cbtAlignedObjectArray<cbtCollisionShape_*> *)local_98;
  uVar4 = shapeData->m_shapeType;
  if (7 < (int)uVar4) {
    switch(uVar4) {
    case 8:
    case 9:
    case 0xb:
    case 0xd:
    case 0x14:
      goto switchD_008b1a6f_caseD_8;
    case 10:
      if ((ulong)(uint)shapeData[3].m_shapeType < 3) {
        iVar17 = (*this->_vptr_cbtCollisionWorldImporter[(ulong)(uint)shapeData[3].m_shapeType + 7])
                           (0x3f800000,0x3f800000,this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_06,iVar17);
        if (pcVar20 == (cbtConvexHullShape *)0x0) {
          return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
        }
        lVar27 = 8;
        do {
          *(undefined4 *)
           ((long)(&(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).
                    super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                    m_implicitShapeDimensions + -2) + lVar27 * 4) =
               *(undefined4 *)(shapeData->m_padding + lVar27 * 4 + -0xc);
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0xc);
        lVar27 = 4;
        (pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.m_collisionMargin = *(cbtScalar *)&shapeData[3].m_name;
        do {
          *(undefined4 *)
           ((long)(&(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).
                    super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                    m_implicitShapeDimensions + -2) + lVar27 * 4) =
               *(undefined4 *)(shapeData->m_padding + lVar27 * 4 + -0xc);
          lVar27 = lVar27 + 1;
        } while (lVar27 != 8);
        *(int *)&(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape
                 .super_cbtConvexInternalShape.field_0x44 = shapeData[3].m_shapeType;
        return (cbtCollisionShape *)pcVar20;
      }
      pcVar26 = "error: wrong up axis for cbtCapsuleShape";
      goto LAB_008b201b;
    case 0xc:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
      return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
    case 0x19:
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x14])(this,shapeData + 1);
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x19])(this,CONCAT44(extraout_var_02,iVar17))
      ;
      plVar21 = (long *)CONCAT44(extraout_var_03,iVar17);
      iVar17 = (**(code **)(*plVar21 + 0x38))(plVar21);
      if (iVar17 == 0) {
        return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
      }
      pcVar26 = shapeData[2].m_name;
      plVar21[1] = *(long *)&shapeData[1].m_shapeType;
      plVar21[2] = (long)pcVar26;
      if (shapeData[3].m_name == (char *)0x0) {
        pcVar22 = (cbtOptimizedBvh *)0x0;
      }
      else {
        local_98._0_8_ = shapeData[3].m_name;
        iVar17 = cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::findIndex
                           (&this->m_bvhMap,(cbtHashPtr *)local_98);
        ppcVar5 = (this->m_bvhMap).m_valueArray.m_data;
        if ((ppcVar5 == (cbtOptimizedBvh **)0x0 || iVar17 == -1) ||
           (pcVar22 = ppcVar5[iVar17], pcVar22 == (cbtOptimizedBvh *)0x0)) {
          iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
          pcVar22 = (cbtOptimizedBvh *)CONCAT44(extraout_var_04,iVar17);
          (*(pcVar22->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[5])(pcVar22,shapeData[3].m_name);
        }
      }
      lVar27._0_4_ = shapeData[3].m_shapeType;
      lVar27._4_1_ = shapeData[3].m_padding[0];
      lVar27._5_1_ = shapeData[3].m_padding[1];
      lVar27._6_1_ = shapeData[3].m_padding[2];
      lVar27._7_1_ = shapeData[3].m_padding[3];
      if (lVar27 != 0) {
        local_98._0_8_ = lVar27;
        iVar17 = cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::findIndex
                           (&this->m_bvhMap,(cbtHashPtr *)local_98);
        ppcVar5 = (this->m_bvhMap).m_valueArray.m_data;
        if ((ppcVar5 == (cbtOptimizedBvh **)0x0 || iVar17 == -1) ||
           (pcVar22 = ppcVar5[iVar17], pcVar22 == (cbtOptimizedBvh *)0x0)) {
          iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
          pcVar22 = (cbtOptimizedBvh *)CONCAT44(extraout_var_11,iVar17);
          uVar16._0_4_ = shapeData[3].m_shapeType;
          uVar16._4_1_ = shapeData[3].m_padding[0];
          uVar16._5_1_ = shapeData[3].m_padding[1];
          uVar16._6_1_ = shapeData[3].m_padding[2];
          uVar16._7_1_ = shapeData[3].m_padding[3];
          (*(pcVar22->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[6])(pcVar22,uVar16);
        }
      }
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x12])(this,plVar21,pcVar22);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_12,iVar17);
      (*(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])((ulong)(uint)shapeData[4].m_shapeType,pcVar20);
      if (shapeData[4].m_name == (char *)0x0) {
        return (cbtCollisionShape *)pcVar20;
      }
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x1b])(this);
      cbtTriangleInfoMap::deSerialize
                ((cbtTriangleInfoMap *)CONCAT44(extraout_var_13,iVar17),
                 (cbtTriangleInfoMapData *)shapeData[4].m_name);
      *(cbtTriangleInfoMap **)
       (pcVar20->super_cbtPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats =
           (cbtTriangleInfoMap *)CONCAT44(extraout_var_13,iVar17);
      return (cbtCollisionShape *)pcVar20;
    case 0x1a:
      shapeData->m_shapeType = 0x19;
      pcVar23 = convertCollisionShape(this,shapeData);
      local_98 = *(undefined1 (*) [16])(shapeData + 5);
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x17])(this,pcVar23);
      return (cbtCollisionShape *)(cbtConvexHullShape *)CONCAT44(extraout_var_05,iVar17);
    default:
      if (uVar4 == 0x25) {
        iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x16])(this);
        local_58.m_ownsMemory = true;
        local_58.m_data = (cbtCollisionShape **)0x0;
        local_58.m_size = 0;
        local_58.m_capacity = 0;
        if (0 < shapeData[1].m_shapeType) {
          lVar34 = 0;
          lVar27 = 0;
          do {
            pcVar23 = convertCollisionShape
                                (this,*(cbtCollisionShapeData **)
                                       (shapeData[1].m_name + lVar27 * 0x50 + 0x40));
            if (pcVar23 != (cbtCollisionShape *)0x0) {
              pcVar6 = shapeData[1].m_name;
              lVar30 = 0;
              pcVar26 = pcVar6 + lVar34;
              puVar28 = local_98;
              do {
                lVar31 = 0;
                do {
                  *(undefined4 *)(puVar28 + lVar31 * 4) = *(undefined4 *)(pcVar26 + lVar31 * 4);
                  lVar31 = lVar31 + 1;
                } while (lVar31 != 4);
                lVar30 = lVar30 + 1;
                puVar28 = puVar28 + 0x10;
                pcVar26 = pcVar26 + 0x10;
              } while (lVar30 != 3);
              lVar30 = 0xc;
              do {
                *(undefined4 *)(local_98 + lVar30 * 4) =
                     *(undefined4 *)(pcVar6 + lVar30 * 4 + lVar34);
                lVar30 = lVar30 + 1;
              } while (lVar30 != 0x10);
              cbtCompoundShape::addChildShape
                        ((cbtCompoundShape *)CONCAT44(extraout_var_07,iVar17),
                         (cbtTransform *)local_98,pcVar23);
            }
            lVar27 = lVar27 + 1;
            lVar34 = lVar34 + 0x50;
          } while (lVar27 < shapeData[1].m_shapeType);
        }
        cbtAlignedObjectArray<cbtCollisionShape_*>::~cbtAlignedObjectArray(&local_58);
        return (cbtCollisionShape *)(cbtConvexHullShape *)CONCAT44(extraout_var_07,iVar17);
      }
      if (uVar4 != 0x22) {
        return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
      }
      local_98 = *(undefined1 (*) [16])(shapeData + 2);
      pcVar29 = &local_58;
      uVar8 = shapeData[1].m_shapeType;
      uVar9 = shapeData[1].m_padding[0];
      uVar11 = shapeData[1].m_padding[1];
      uVar13 = shapeData[1].m_padding[2];
      uVar15 = shapeData[1].m_padding[3];
      uVar14 = CONCAT11(uVar15,uVar13);
      uVar12 = CONCAT21(uVar14,uVar11);
      uVar10 = CONCAT31(uVar12,uVar9);
      local_58._0_4_ = SUB84(shapeData[1].m_name,0);
      local_58.m_size = (int)((ulong)shapeData[1].m_name >> 0x20);
      local_58.m_capacity = uVar8;
      local_58._12_4_ = uVar10;
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[4])
                         ((ulong)*(uint *)&shapeData[3].m_name,this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_00,iVar17);
      pp_Var25 = (pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape
                 .super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
                 _vptr_cbtCollisionShape;
      goto LAB_008b2195;
    }
  }
  if ((uVar4 != 0) && (uVar4 != 4)) {
    return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
  }
switchD_008b1a6f_caseD_8:
  pcVar26 = shapeData[2].m_name;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = pcVar26;
  fVar3 = *(float *)&shapeData[3].m_name;
  if (0xd < uVar4) {
    if (uVar4 != 0x14) goto switchD_008b1a99_caseD_1;
    auVar37 = vmovshdup_avx(auVar37);
    iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0xd])
                       ((ulong)(uint)(fVar3 + SUB84(pcVar26,0)),(ulong)(uint)(fVar3 + auVar37._0_4_)
                        ,this);
    pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_01,iVar17);
    goto LAB_008b1d99;
  }
  switch(uVar4) {
  case 0:
    auVar35._8_8_ = 0;
    auVar35._0_8_ = shapeData[1].m_name;
    auVar37 = vdivps_avx(auVar37,auVar35);
    auVar36._0_4_ = fVar3 + auVar37._0_4_;
    auVar36._4_4_ = fVar3 + auVar37._4_4_;
    auVar36._8_4_ = fVar3 + auVar37._8_4_;
    auVar36._12_4_ = fVar3 + auVar37._12_4_;
    local_98 = vinsertps_avx(auVar36,ZEXT416((uint)(fVar3 + (float)shapeData[2].m_shapeType /
                                                            (float)shapeData[1].m_shapeType)),0x28);
    iVar17 = (*this->_vptr_cbtCollisionWorldImporter[5])(this);
    pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var,iVar17);
    break;
  default:
switchD_008b1a99_caseD_1:
    printf("error: cannot create shape type (%d)\n");
    return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
  case 4:
    iVar17 = shapeData[4].m_shapeType;
    lVar27 = (long)iVar17;
    local_80 = true;
    local_88 = (cbtVector3 *)0x0;
    local_98._4_8_ = 0;
    if (lVar27 < 1) {
      local_98._4_4_ = iVar17;
    }
    else {
      pcVar24 = (cbtVector3 *)cbtAlignedAllocInternal(lVar27 << 4,0x10);
      if ((long)(int)local_98._4_4_ < 1) {
        if (local_88 != (cbtVector3 *)0x0) goto LAB_008b209d;
      }
      else {
        lVar34 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_88->m_floats + lVar34);
          uVar16 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar24->m_floats + lVar34);
          *puVar2 = *puVar1;
          puVar2[1] = uVar16;
          lVar34 = lVar34 + 0x10;
        } while ((long)(int)local_98._4_4_ * 0x10 != lVar34);
LAB_008b209d:
        if (local_80 == true) {
          cbtAlignedFreeInternal(local_88);
        }
      }
      auVar37 = local_98;
      local_98._8_4_ = iVar17;
      local_98._0_4_ = auVar37._0_4_;
      local_98._4_4_ = iVar17;
      local_88 = pcVar24;
      if (0 < iVar17) {
        lVar34._0_4_ = shapeData[3].m_shapeType;
        lVar34._4_1_ = shapeData[3].m_padding[0];
        lVar34._5_1_ = shapeData[3].m_padding[1];
        lVar34._6_1_ = shapeData[3].m_padding[2];
        lVar34._7_1_ = shapeData[3].m_padding[3];
        pcVar26 = shapeData[4].m_name;
        lVar31 = 0;
        lVar30 = lVar34;
        pcVar32 = pcVar24;
        do {
          if (lVar34 != 0) {
            lVar33 = 0;
            do {
              pcVar32->m_floats[lVar33] = *(cbtScalar *)(lVar30 + lVar33 * 4);
              lVar33 = lVar33 + 1;
            } while (lVar33 != 4);
          }
          if (pcVar26 != (char *)0x0) {
            auVar37 = vcvtpd2ps_avx(*(undefined1 (*) [32])(pcVar26 + lVar31 * 0x20));
            *(undefined1 (*) [16])pcVar24[lVar31].m_floats = auVar37;
          }
          lVar31 = lVar31 + 1;
          pcVar32 = pcVar32 + 1;
          lVar30 = lVar30 + 0x10;
        } while (lVar31 != lVar27);
      }
    }
    local_80 = true;
    iVar19 = (*this->_vptr_cbtCollisionWorldImporter[0x15])(this);
    pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_18,iVar19);
    if (0 < iVar17) {
      lVar34 = 0;
      do {
        cbtConvexHullShape::addPoint(pcVar20,(cbtVector3 *)((long)local_88->m_floats + lVar34),true)
        ;
        lVar34 = lVar34 + 0x10;
      } while (lVar27 * 0x10 != lVar34);
    }
    (*(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
      super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0xb])((ulong)*(uint *)&shapeData[3].m_name,pcVar20);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtVector3> *)local_98);
    goto LAB_008b2172;
  case 8:
    iVar17 = (*this->_vptr_cbtCollisionWorldImporter[6])(pcVar26,this);
    pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_08,iVar17);
    break;
  case 9:
    uVar4 = *(uint *)&shapeData[4].m_name;
    lVar27 = (long)(int)uVar4;
    __s = (cbtCollisionShape **)0x0;
    local_80 = true;
    local_58.m_ownsMemory = true;
    local_88 = (cbtVector3 *)0x0;
    local_58.m_data = (cbtCollisionShape **)0x0;
    local_98._4_8_ = 0;
    local_58.m_size = 0;
    local_58.m_capacity = 0;
    uVar18 = 0;
    if (0 < lVar27) {
      __s = (cbtCollisionShape **)cbtAlignedAllocInternal(lVar27 * 4,0x10);
      if ((long)local_58.m_size < 1) {
        if (local_58.m_data != (cbtCollisionShape **)0x0) goto LAB_008b202d;
      }
      else {
        lVar34 = 0;
        do {
          *(undefined4 *)((long)__s + lVar34 * 4) =
               *(undefined4 *)((long)local_58.m_data + lVar34 * 4);
          lVar34 = lVar34 + 1;
        } while (local_58.m_size != lVar34);
LAB_008b202d:
        if (local_58.m_ownsMemory == true) {
          cbtAlignedFreeInternal(local_58.m_data);
        }
      }
      local_58.m_ownsMemory = true;
      local_58.m_capacity = uVar4;
      local_58.m_data = __s;
      memset(__s,0,lVar27 * 4);
      uVar18 = local_98._4_4_;
    }
    local_58.m_size = uVar4;
    if (((int)uVar18 < (int)uVar4) && (__s = local_58.m_data, (int)local_98._8_4_ < (int)uVar4)) {
      if (uVar4 == 0) {
        pcVar24 = (cbtVector3 *)0x0;
      }
      else {
        pcVar24 = (cbtVector3 *)cbtAlignedAllocInternal(lVar27 << 4,0x10);
        uVar18 = local_98._4_4_;
      }
      if ((int)uVar18 < 1) {
        if (local_88 != (cbtVector3 *)0x0) goto LAB_008b21d9;
      }
      else {
        lVar34 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_88->m_floats + lVar34);
          uVar16 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar24->m_floats + lVar34);
          *puVar2 = *puVar1;
          puVar2[1] = uVar16;
          lVar34 = lVar34 + 0x10;
        } while ((ulong)uVar18 << 4 != lVar34);
LAB_008b21d9:
        if (local_80 == true) {
          cbtAlignedFreeInternal(local_88);
        }
      }
      local_80 = true;
      local_98._8_4_ = uVar4;
      __s = local_58.m_data;
      local_88 = pcVar24;
    }
    local_98._4_4_ = uVar4;
    if (0 < (int)uVar4) {
      lVar34 = *(long *)&shapeData[3].m_shapeType;
      lVar31 = 0;
      lVar30 = lVar34;
      pcVar24 = local_88;
      do {
        lVar33 = 0;
        do {
          pcVar24->m_floats[lVar33] = *(cbtScalar *)(lVar30 + lVar33 * 4);
          lVar33 = lVar33 + 1;
        } while (lVar33 != 4);
        pcVar24 = pcVar24 + 1;
        lVar30 = lVar30 + 0x14;
        *(undefined4 *)((long)__s + lVar31 * 4) = *(undefined4 *)(lVar34 + 0x10 + lVar31 * 0x14);
        lVar31 = lVar31 + 1;
      } while (lVar31 != lVar27);
    }
    iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x18])(this,local_88,__s,(ulong)uVar4);
    pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_19,iVar17);
    cbtAlignedObjectArray<float>::~cbtAlignedObjectArray((cbtAlignedObjectArray<float> *)&local_58);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtVector3> *)local_98);
    break;
  case 0xb:
    iVar17 = shapeData[3].m_shapeType;
    if (iVar17 == 2) {
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0x10])(pcVar26,this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_17,iVar17);
    }
    else if (iVar17 == 1) {
      auVar37 = vmovshdup_avx(auVar37);
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0xf])(pcVar26,auVar37._0_8_,this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_16,iVar17);
    }
    else {
      if (iVar17 != 0) {
        pcVar26 = "unknown Cone up axis";
LAB_008b201b:
        puts(pcVar26);
        return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
      }
      auVar37 = vmovshdup_avx(auVar37);
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0xe])(auVar37._0_8_,pcVar26,this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_10,iVar17);
    }
    break;
  case 0xd:
    iVar17 = shapeData[3].m_shapeType;
    fVar7 = fVar3 + SUB84(pcVar26,0);
    if (iVar17 == 2) {
      iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0xc])
                         ((ulong)(uint)fVar7,(ulong)(uint)(fVar3 + (float)shapeData[2].m_shapeType),
                          this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_15,iVar17);
    }
    else {
      auVar37 = vmovshdup_avx(auVar37);
      if (iVar17 == 1) {
        iVar17 = (*this->_vptr_cbtCollisionWorldImporter[0xb])((ulong)(uint)fVar7,this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_14,iVar17);
      }
      else {
        if (iVar17 != 0) {
          pcVar26 = "unknown Cylinder up axis";
          goto LAB_008b201b;
        }
        iVar17 = (*this->_vptr_cbtCollisionWorldImporter[10])
                           ((ulong)(uint)(fVar3 + auVar37._0_4_),(ulong)(uint)fVar7,this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_09,iVar17);
      }
    }
  }
LAB_008b1d99:
  if (pcVar20 == (cbtConvexHullShape *)0x0) {
    return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
  }
LAB_008b2172:
  (*(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
    super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xb])((ulong)*(uint *)&shapeData[3].m_name,pcVar20);
  local_98 = *(undefined1 (*) [16])(shapeData + 1);
  pp_Var25 = (pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
             super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
             _vptr_cbtCollisionShape;
LAB_008b2195:
  (*pp_Var25[6])(pcVar20,pcVar29);
  return (cbtCollisionShape *)pcVar20;
}

Assistant:

cbtCollisionShape* cbtCollisionWorldImporter::convertCollisionShape(cbtCollisionShapeData* shapeData)
{
	cbtCollisionShape* shape = 0;

	switch (shapeData->m_shapeType)
	{
		case STATIC_PLANE_PROXYTYPE:
		{
			cbtStaticPlaneShapeData* planeData = (cbtStaticPlaneShapeData*)shapeData;
			cbtVector3 planeNormal, localScaling;
			planeNormal.deSerializeFloat(planeData->m_planeNormal);
			localScaling.deSerializeFloat(planeData->m_localScaling);
			shape = createPlaneShape(planeNormal, planeData->m_planeConstant);
			shape->setLocalScaling(localScaling);

			break;
		}
		case SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			cbtScaledTriangleMeshShapeData* scaledMesh = (cbtScaledTriangleMeshShapeData*)shapeData;
			cbtCollisionShapeData* colShapeData = (cbtCollisionShapeData*)&scaledMesh->m_trimeshShapeData;
			colShapeData->m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
			cbtCollisionShape* childShape = convertCollisionShape(colShapeData);
			cbtBvhTriangleMeshShape* meshShape = (cbtBvhTriangleMeshShape*)childShape;
			cbtVector3 localScaling;
			localScaling.deSerializeFloat(scaledMesh->m_localScaling);

			shape = createScaledTrangleMeshShape(meshShape, localScaling);
			break;
		}
#ifdef SUPPORT_GIMPACT_SHAPE_IMPORT
		case GIMPACT_SHAPE_PROXYTYPE:
		{
			cbtGImpactMeshShapeData* gimpactData = (cbtGImpactMeshShapeData*)shapeData;
			if (gimpactData->m_gimpactSubType == CONST_GIMPACT_TRIMESH_SHAPE)
			{
				cbtStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&gimpactData->m_meshInterface);
				cbtTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);

				cbtGImpactMeshShape* gimpactShape = createGimpactShape(meshInterface);
				cbtVector3 localScaling;
				localScaling.deSerializeFloat(gimpactData->m_localScaling);
				gimpactShape->setLocalScaling(localScaling);
				gimpactShape->setMargin(cbtScalar(gimpactData->m_collisionMargin));
				gimpactShape->updateBound();
				shape = gimpactShape;
			}
			else
			{
				printf("unsupported gimpact sub type\n");
			}
			break;
		}
#endif  //SUPPORT_GIMPACT_SHAPE_IMPORT                                                                        \
		//The cbtCapsuleShape* API has issue passing the margin/scaling/halfextents unmodified through the API \
		//so deal with this
		case CAPSULE_SHAPE_PROXYTYPE:
		{
			cbtCapsuleShapeData* capData = (cbtCapsuleShapeData*)shapeData;

			switch (capData->m_upAxis)
			{
				case 0:
				{
					shape = createCapsuleShapeX(1, 1);
					break;
				}
				case 1:
				{
					shape = createCapsuleShapeY(1, 1);
					break;
				}
				case 2:
				{
					shape = createCapsuleShapeZ(1, 1);
					break;
				}
				default:
				{
					printf("error: wrong up axis for cbtCapsuleShape\n");
				}
			};
			if (shape)
			{
				cbtCapsuleShape* cap = (cbtCapsuleShape*)shape;
				cap->deSerializeFloat(capData);
			}
			break;
		}
		case CYLINDER_SHAPE_PROXYTYPE:
        case CYLSHELL_SHAPE_PROXYTYPE:
		case CONE_SHAPE_PROXYTYPE:
		case BOX_SHAPE_PROXYTYPE:
		case SPHERE_SHAPE_PROXYTYPE:
		case MULTI_SPHERE_SHAPE_PROXYTYPE:
		case CONVEX_HULL_SHAPE_PROXYTYPE:
		{
			cbtConvexInternalShapeData* bsd = (cbtConvexInternalShapeData*)shapeData;
			cbtVector3 implicitShapeDimensions;
			implicitShapeDimensions.deSerializeFloat(bsd->m_implicitShapeDimensions);
			cbtVector3 localScaling;
			localScaling.deSerializeFloat(bsd->m_localScaling);
			cbtVector3 margin(bsd->m_collisionMargin, bsd->m_collisionMargin, bsd->m_collisionMargin);
			switch (shapeData->m_shapeType)
			{
				case BOX_SHAPE_PROXYTYPE:
				{
					cbtBoxShape* box = (cbtBoxShape*)createBoxShape(implicitShapeDimensions / localScaling + margin);
					//box->initializePolyhedralFeatures();
					shape = box;

					break;
				}
				case SPHERE_SHAPE_PROXYTYPE:
				{
					shape = createSphereShape(implicitShapeDimensions.getX());
					break;
				}

				case CYLINDER_SHAPE_PROXYTYPE:
				{
					cbtCylinderShapeData* cylData = (cbtCylinderShapeData*)shapeData;
					cbtVector3 halfExtents = implicitShapeDimensions + margin;
					switch (cylData->m_upAxis)
					{
						case 0:
						{
							shape = createCylinderShapeX(halfExtents.getY(), halfExtents.getX());
							break;
						}
						case 1:
						{
							shape = createCylinderShapeY(halfExtents.getX(), halfExtents.getY());
							break;
						}
						case 2:
						{
							shape = createCylinderShapeZ(halfExtents.getX(), halfExtents.getZ());
							break;
						}
						default:
						{
							printf("unknown Cylinder up axis\n");
						}
					};

					break;
				}

                case CYLSHELL_SHAPE_PROXYTYPE: { /* ***CHRONO*** */
                    ////cbtCylindricalShellShapeData* cylData = (cbtCylindricalShellShapeData*)shapeData;
                    cbtVector3 halfExtents = implicitShapeDimensions + margin;
                    cbtScalar radius = halfExtents.getX();
                    cbtScalar hlen = halfExtents.getY();
					shape = createCylindricalShellShape(radius, hlen);

                    break;
                }

				case CONE_SHAPE_PROXYTYPE:
				{
					cbtConeShapeData* conData = (cbtConeShapeData*)shapeData;
					cbtVector3 halfExtents = implicitShapeDimensions;  //+margin;
					switch (conData->m_upIndex)
					{
						case 0:
						{
							shape = createConeShapeX(halfExtents.getY(), halfExtents.getX());
							break;
						}
						case 1:
						{
							shape = createConeShapeY(halfExtents.getX(), halfExtents.getY());
							break;
						}
						case 2:
						{
							shape = createConeShapeZ(halfExtents.getX(), halfExtents.getZ());
							break;
						}
						default:
						{
							printf("unknown Cone up axis\n");
						}
					};

					break;
				}
				case MULTI_SPHERE_SHAPE_PROXYTYPE:
				{
					cbtMultiSphereShapeData* mss = (cbtMultiSphereShapeData*)bsd;
					int numSpheres = mss->m_localPositionArraySize;

					cbtAlignedObjectArray<cbtVector3> tmpPos;
					cbtAlignedObjectArray<cbtScalar> radii;
					radii.resize(numSpheres);
					tmpPos.resize(numSpheres);
					int i;
					for (i = 0; i < numSpheres; i++)
					{
						tmpPos[i].deSerializeFloat(mss->m_localPositionArrayPtr[i].m_pos);
						radii[i] = mss->m_localPositionArrayPtr[i].m_radius;
					}
					shape = createMultiSphereShape(&tmpPos[0], &radii[0], numSpheres);
					break;
				}
				case CONVEX_HULL_SHAPE_PROXYTYPE:
				{
					//	int sz = sizeof(cbtConvexHullShapeData);
					//	int sz2 = sizeof(cbtConvexInternalShapeData);
					//	int sz3 = sizeof(cbtCollisionShapeData);
					cbtConvexHullShapeData* convexData = (cbtConvexHullShapeData*)bsd;
					int numPoints = convexData->m_numUnscaledPoints;

					cbtAlignedObjectArray<cbtVector3> tmpPoints;
					tmpPoints.resize(numPoints);
					int i;
					for (i = 0; i < numPoints; i++)
					{
#ifdef BT_USE_DOUBLE_PRECISION
						if (convexData->m_unscaledPointsDoublePtr)
							tmpPoints[i].deSerialize(convexData->m_unscaledPointsDoublePtr[i]);
						if (convexData->m_unscaledPointsFloatPtr)
							tmpPoints[i].deSerializeFloat(convexData->m_unscaledPointsFloatPtr[i]);
#else
						if (convexData->m_unscaledPointsFloatPtr)
							tmpPoints[i].deSerialize(convexData->m_unscaledPointsFloatPtr[i]);
						if (convexData->m_unscaledPointsDoublePtr)
							tmpPoints[i].deSerializeDouble(convexData->m_unscaledPointsDoublePtr[i]);
#endif  //BT_USE_DOUBLE_PRECISION
					}
					cbtConvexHullShape* hullShape = createConvexHullShape();
					for (i = 0; i < numPoints; i++)
					{
						hullShape->addPoint(tmpPoints[i]);
					}
					hullShape->setMargin(bsd->m_collisionMargin);
					//hullShape->initializePolyhedralFeatures();
					shape = hullShape;
					break;
				}
				default:
				{
					printf("error: cannot create shape type (%d)\n", shapeData->m_shapeType);
				}
			}

			if (shape)
			{
				shape->setMargin(bsd->m_collisionMargin);

				cbtVector3 localScaling;
				localScaling.deSerializeFloat(bsd->m_localScaling);
				shape->setLocalScaling(localScaling);
			}
			break;
		}
		case TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			cbtTriangleMeshShapeData* trimesh = (cbtTriangleMeshShapeData*)shapeData;
			cbtStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&trimesh->m_meshInterface);
			cbtTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);
			if (!meshInterface->getNumSubParts())
			{
				return 0;
			}

			cbtVector3 scaling;
			scaling.deSerializeFloat(trimesh->m_meshInterface.m_scaling);
			meshInterface->setScaling(scaling);

			cbtOptimizedBvh* bvh = 0;
#if 1
			if (trimesh->m_quantizedFloatBvh)
			{
				cbtOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedFloatBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				}
				else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeFloat(*trimesh->m_quantizedFloatBvh);
				}
			}
			if (trimesh->m_quantizedDoubleBvh)
			{
				cbtOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedDoubleBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				}
				else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeDouble(*trimesh->m_quantizedDoubleBvh);
				}
			}
#endif

			cbtBvhTriangleMeshShape* trimeshShape = createBvhTriangleMeshShape(meshInterface, bvh);
			trimeshShape->setMargin(trimesh->m_collisionMargin);
			shape = trimeshShape;

			if (trimesh->m_triangleInfoMap)
			{
				cbtTriangleInfoMap* map = createTriangleInfoMap();
				map->deSerialize(*trimesh->m_triangleInfoMap);
				trimeshShape->setTriangleInfoMap(map);

#ifdef USE_INTERNAL_EDGE_UTILITY
				gContactAddedCallback = cbtAdjustInternalEdgeContactsCallback;
#endif  //USE_INTERNAL_EDGE_UTILITY
			}

			//printf("trimesh->m_collisionMargin=%f\n",trimesh->m_collisionMargin);
			break;
		}
		case COMPOUND_SHAPE_PROXYTYPE:
		{
			cbtCompoundShapeData* compoundData = (cbtCompoundShapeData*)shapeData;
			cbtCompoundShape* compoundShape = createCompoundShape();

			//cbtCompoundShapeChildData* childShapeDataArray = &compoundData->m_childShapePtr[0];

			cbtAlignedObjectArray<cbtCollisionShape*> childShapes;
			for (int i = 0; i < compoundData->m_numChildShapes; i++)
			{
				//cbtCompoundShapeChildData* ptr = &compoundData->m_childShapePtr[i];

				cbtCollisionShapeData* cd = compoundData->m_childShapePtr[i].m_childShape;

				cbtCollisionShape* childShape = convertCollisionShape(cd);
				if (childShape)
				{
					cbtTransform localTransform;
					localTransform.deSerializeFloat(compoundData->m_childShapePtr[i].m_transform);
					compoundShape->addChildShape(localTransform, childShape);
				}
				else
				{
#ifdef _DEBUG
					printf("error: couldn't create childShape for compoundShape\n");
#endif
				}
			}
			shape = compoundShape;

			break;
		}
		case SOFTBODY_SHAPE_PROXYTYPE:
		{
			return 0;
		}
		default:
		{
#ifdef _DEBUG
			printf("unsupported shape type (%d)\n", shapeData->m_shapeType);
#endif
		}
	}

	return shape;
}